

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

char ** lys_features_list(lys_module *module,uint8_t **states)

{
  lys_feature *plVar1;
  lys_submodule *plVar2;
  char **__ptr;
  uint8_t *puVar3;
  ulong uVar4;
  LY_ERR *pLVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  
  if (module == (lys_module *)0x0) {
LAB_00153d74:
    __ptr = (char **)0x0;
  }
  else {
    bVar11 = module->features_size;
    uVar10 = (uint)bVar11;
    for (lVar6 = 0; (ulong)module->inc_size * 0x30 - lVar6 != 0; lVar6 = lVar6 + 0x30) {
      uVar10 = uVar10 + *(byte *)(*(long *)(module->inc->rev + lVar6 + -8) + 0x47);
    }
    __ptr = (char **)malloc((ulong)(uVar10 + 1) * 8);
    if (__ptr == (char **)0x0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_features_list");
      return (char **)0x0;
    }
    if (states != (uint8_t **)0x0) {
      puVar3 = (uint8_t *)malloc((ulong)(uVar10 + 1));
      *states = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_features_list");
        free(__ptr);
        goto LAB_00153d74;
      }
    }
    lVar6 = 0;
    for (uVar4 = 0; uVar4 < bVar11; uVar4 = uVar4 + 1) {
      plVar1 = module->features;
      __ptr[uVar4] = *(char **)(plVar1->padding + lVar6 + -0x1c);
      if (states != (uint8_t **)0x0) {
        (*states)[uVar4] = plVar1->padding[lVar6 + -3] & 1;
      }
      bVar11 = module->features_size;
      lVar6 = lVar6 + 0x40;
    }
    uVar7 = 0;
    while( true ) {
      if (module->inc_size <= uVar7) break;
      lVar6 = 0;
      for (uVar8 = 0; plVar2 = module->inc[uVar7].submodule, uVar8 < plVar2->features_size;
          uVar8 = uVar8 + 1) {
        plVar1 = plVar2->features;
        uVar9 = (uVar4 & 0xffffffff) + uVar8 & 0xffffffff;
        __ptr[uVar9] = *(char **)(plVar1->padding + lVar6 + -0x1c);
        if (states != (uint8_t **)0x0) {
          (*states)[uVar9] = plVar1->padding[lVar6 + -3] & 1;
        }
        lVar6 = lVar6 + 0x40;
      }
      uVar7 = uVar7 + 1;
      uVar4 = (ulong)(uint)((int)uVar4 + (int)uVar8);
    }
    __ptr[uVar4 & 0xffffffff] = (char *)0x0;
  }
  return __ptr;
}

Assistant:

API const char **
lys_features_list(const struct lys_module *module, uint8_t **states)
{
    const char **result = NULL;
    int i, j;
    unsigned int count;

    if (!module) {
        return NULL;
    }

    count = module->features_size;
    for (i = 0; i < module->inc_size; i++) {
        count += module->inc[i].submodule->features_size;
    }
    result = malloc((count + 1) * sizeof *result);
    if (!result) {
        LOGMEM;
        return NULL;
    }
    if (states) {
        *states = malloc((count + 1) * sizeof **states);
        if (!(*states)) {
            LOGMEM;
            free(result);
            return NULL;
        }
    }
    count = 0;

    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        result[count] = module->features[i].name;
        if (states) {
            if (module->features[i].flags & LYS_FENABLED) {
                (*states)[count] = 1;
            } else {
                (*states)[count] = 0;
            }
        }
        count++;
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            result[count] = module->inc[j].submodule->features[i].name;
            if (states) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    (*states)[count] = 1;
                } else {
                    (*states)[count] = 0;
                }
            }
            count++;
        }
    }

    /* terminating NULL byte */
    result[count] = NULL;

    return result;
}